

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotation_test_util.cc
# Opt level: O0

void google::protobuf::compiler::annotation_test_util::AddFile
               (string_view filename,string_view data)

{
  string_view contents;
  bool bVar1;
  char *failure_msg;
  LogMessage *pLVar2;
  AlphaNum *in_R8;
  Status *local_180;
  LogMessage local_160;
  Voidify local_149;
  char *local_148;
  char *pcStack_140;
  size_t local_138;
  char *pcStack_130;
  AlphaNum local_120;
  AlphaNum local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  AlphaNum local_90;
  string local_60;
  Status local_40;
  undefined1 local_38 [8];
  pair<const_absl::lts_20250127::Status_*,_const_char_*> absl_log_internal_check_ok_goo;
  string_view data_local;
  string_view filename_local;
  
  absl_log_internal_check_ok_goo.second = (char *)data._M_len;
  std::pair<const_absl::lts_20250127::Status_*,_const_char_*>::
  pair<const_absl::lts_20250127::Status_*,_const_char_*,_true>
            ((pair<const_absl::lts_20250127::Status_*,_const_char_*> *)local_38);
  TestTempDir_abi_cxx11_();
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_90,&local_b0);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_f0,"/");
  local_138 = filename._M_len;
  pcStack_130 = filename._M_str;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_120,filename);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_60,(lts_20250127 *)&local_90,&local_f0,&local_120,in_R8);
  local_148 = absl_log_internal_check_ok_goo.second;
  contents._M_str = data._M_str;
  contents._M_len = (size_t)absl_log_internal_check_ok_goo.second;
  pcStack_140 = data._M_str;
  File::SetContents((File *)&local_40,&local_60,contents,true);
  local_38 = (undefined1  [8])absl::lts_20250127::log_internal::AsStatus(&local_40);
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_38);
  if (bVar1) {
    local_180 = (Status *)0x0;
  }
  else {
    local_180 = (Status *)
                absl::lts_20250127::status_internal::MakeCheckFailString
                          ((Nonnull<const_absl::Status_*>)local_38,
                           "File::SetContents( absl::StrCat(TestTempDir(), \"/\", filename), data, true) is OK"
                          );
  }
  absl_log_internal_check_ok_goo.first = local_180;
  bVar1 = absl::lts_20250127::Status::ok((Status *)local_38);
  absl::lts_20250127::Status::~Status(&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_b0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  failure_msg = absl::lts_20250127::implicit_cast<char_const*>
                          ((type_identity_t<const_char_*>)absl_log_internal_check_ok_goo.first);
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_160,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/annotation_test_util.cc"
             ,0x35,failure_msg);
  pLVar2 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_160);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_149,pLVar2);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_160)
  ;
}

Assistant:

void AddFile(absl::string_view filename, absl::string_view data) {
  ABSL_CHECK_OK(File::SetContents(
      absl::StrCat(TestTempDir(), "/", filename), data, true));
}